

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O0

void * uprv_calloc_63(size_t num,size_t size)

{
  void *__s;
  void *mem;
  size_t size_local;
  size_t num_local;
  
  __s = uprv_malloc_63(num * size);
  if (__s != (void *)0x0) {
    memset(__s,0,num * size);
  }
  return __s;
}

Assistant:

U_CAPI void * U_EXPORT2
uprv_calloc(size_t num, size_t size) {
    void *mem = NULL;
    size *= num;
    mem = uprv_malloc(size);
    if (mem) {
        uprv_memset(mem, 0, size);
    }
    return mem;
}